

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

NotificationHandle * __thiscall
jsonrpccxx::notificationHandle<SomeClass,std::__cxx11::string_const&>
          (NotificationHandle *__return_storage_ptr__,jsonrpccxx *this,
          offset_in_SomeClass_to_subr method,SomeClass *instance)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *method_00;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_90;
  anon_class_24_2_b747b145 local_70;
  undefined1 local_58 [8];
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  function;
  SomeClass *instance_local;
  offset_in_SomeClass_to_subr method_local;
  
  local_70.instance = instance;
  local_70.method = (offset_in_SomeClass_to_subr)this;
  local_70._16_8_ = method;
  function._M_invoker = (_Invoker_type)instance;
  std::function<void(std::__cxx11::string_const&)>::
  function<jsonrpccxx::notificationHandle<SomeClass,std::__cxx11::string_const&>(void(SomeClass::*)(std::__cxx11::string_const&),SomeClass&)::_lambda(std::__cxx11::string_const&)_1_,void>
            ((function<void(std::__cxx11::string_const&)> *)local_58,&local_70);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_90,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_58);
  notificationHandle<std::__cxx11::string_const&>
            (__return_storage_ptr__,(jsonrpccxx *)&local_90,method_00);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_90);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)local_58);
  return __return_storage_ptr__;
}

Assistant:

NotificationHandle notificationHandle(void (T::*method)(ParamTypes...), T &instance) {
    std::function<void(ParamTypes...)> function = [&instance, method](ParamTypes &&... params) -> void {
      return (instance.*method)(std::forward<ParamTypes>(params)...);
    };
    return notificationHandle(function);
  }